

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void init_supported_formats
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                *formats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Converter *pCVar2;
  mapped_type *pmVar3;
  pointer *__ptr;
  Converter *local_38;
  key_type local_30;
  
  HawkTracer::parser::make_unique<HawkTracer::client::ChromeTraceConverter>();
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"chrome-tracing","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
           ::operator[](formats,&local_30);
  pCVar2 = (pmVar3->_M_t).
           super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
           .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
  .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl = local_38;
  if (pCVar2 != (Converter *)0x0) {
    (*pCVar2->_vptr_Converter[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  HawkTracer::parser::make_unique<HawkTracer::client::CallgrindConverter>();
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"callgrind","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
           ::operator[](formats,&local_30);
  pCVar2 = (pmVar3->_M_t).
           super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
           .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
  .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl = (Converter *)0x0;
  if (pCVar2 != (Converter *)0x0) {
    (*pCVar2->_vptr_Converter[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void init_supported_formats(std::map<std::string, std::unique_ptr<client::Converter>>& formats)
{
    formats["chrome-tracing"] = parser::make_unique<client::ChromeTraceConverter>();
    formats["callgrind"] = parser::make_unique<client::CallgrindConverter>();
}